

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_RSAPSS.c
# Opt level: O1

_Bool Hacl_RSAPSS_rsapss_pkey_verify
                (Spec_Hash_Definitions_hash_alg a,uint32_t modBits,uint32_t eBits,uint8_t *nb,
                uint8_t *eb,uint32_t saltLen,uint32_t sgntLen,uint8_t *sgnt,uint32_t msgLen,
                uint8_t *msg)

{
  int iVar1;
  uint64_t *res;
  long lVar2;
  uint8_t *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint32_t saltLen_00;
  Spec_Hash_Definitions_hash_alg a_00;
  _Bool _Var6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint uVar9;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  undefined7 in_register_00000039;
  uint64_t *n;
  uint64_t *res_00;
  uint uVar10;
  ulong uVar11;
  uint64_t *res_01;
  undefined8 auStack_90 [2];
  ulong auStack_80 [3];
  uint64_t uStack_68;
  uint8_t *local_60;
  undefined8 local_58;
  uint8_t *local_50;
  undefined8 local_48;
  uint local_3c;
  uint32_t local_38;
  undefined4 local_34;
  
  local_58 = CONCAT44(in_register_00000034,modBits);
  local_48 = CONCAT44(in_register_00000014,eBits);
  local_34 = (undefined4)CONCAT71(in_register_00000039,a);
  uVar9 = modBits - 1;
  uVar10 = uVar9 >> 6;
  iVar1 = (eBits - 1 >> 6) + uVar10 * 2;
  lVar2 = -(ulong)(iVar1 * 8 + 0x27U & 0xfffffff0);
  res_00 = (uint64_t *)((long)&uStack_68 + lVar2);
  local_60 = eb;
  local_50 = nb;
  local_3c = uVar9;
  local_38 = saltLen;
  *(undefined8 *)((long)auStack_80 + lVar2 + 0x10) = 0x16ace1;
  memset(res_00,0,(ulong)(uint)(iVar1 * 8) + 0x18);
  puVar3 = local_50;
  uVar11 = (ulong)(uVar10 * 8 + 8);
  res = (uint64_t *)(uVar11 + (long)res_00);
  res_01 = (uint64_t *)(uVar11 + (long)res);
  *(undefined8 *)((long)auStack_80 + lVar2 + 0x10) = 0x16ad0f;
  Hacl_Bignum_Convert_bn_from_bytes_be_uint64((uVar9 >> 3) + 1,puVar3,res_00);
  uVar9 = local_3c;
  uVar5 = local_48;
  uVar4 = local_58;
  *(undefined8 *)((long)auStack_80 + lVar2 + 0x10) = 0x16ad28;
  Hacl_Bignum_Montgomery_bn_precomp_r2_mod_n_u64(uVar10 + 1,uVar9,res_00,res);
  puVar3 = local_60;
  *(undefined8 *)((long)auStack_80 + lVar2 + 0x10) = 0x16ad36;
  Hacl_Bignum_Convert_bn_from_bytes_be_uint64((eBits - 1 >> 3) + 1,puVar3,res_01);
  *(undefined8 *)((long)auStack_80 + lVar2 + 0x10) = 0x16ad41;
  uVar7 = check_modulus_u64((uint32_t)uVar4,res_00);
  *(undefined8 *)((long)auStack_80 + lVar2 + 0x10) = 0x16ad4f;
  uVar8 = check_exponent_u64((uint32_t)uVar5,res_01);
  saltLen_00 = local_38;
  _Var6 = false;
  if ((uVar8 & uVar7) == 0xffffffffffffffff) {
    a_00 = (Spec_Hash_Definitions_hash_alg)local_34;
    *(uint8_t **)((long)auStack_80 + lVar2 + 8) = msg;
    *(ulong *)((long)auStack_80 + lVar2) = (ulong)msgLen;
    *(uint8_t **)((long)auStack_90 + lVar2 + 8) = sgnt;
    *(undefined8 *)((long)auStack_90 + lVar2) = 0x16ad85;
    _Var6 = Hacl_RSAPSS_rsapss_verify
                      (a_00,(uint32_t)uVar4,(uint32_t)uVar5,res_00,saltLen_00,sgntLen,
                       *(uint8_t **)((long)auStack_90 + lVar2 + 8),
                       *(uint32_t *)((long)auStack_80 + lVar2),
                       *(uint8_t **)((long)auStack_80 + lVar2 + 8));
  }
  return _Var6;
}

Assistant:

bool
Hacl_RSAPSS_rsapss_pkey_verify(
  Spec_Hash_Definitions_hash_alg a,
  uint32_t modBits,
  uint32_t eBits,
  uint8_t *nb,
  uint8_t *eb,
  uint32_t saltLen,
  uint32_t sgntLen,
  uint8_t *sgnt,
  uint32_t msgLen,
  uint8_t *msg
)
{
  KRML_CHECK_SIZE(sizeof (uint64_t), 2U * ((modBits - 1U) / 64U + 1U) + (eBits - 1U) / 64U + 1U);
  uint64_t pkey[2U * ((modBits - 1U) / 64U + 1U) + (eBits - 1U) / 64U + 1U];
  memset(pkey,
    0U,
    (2U * ((modBits - 1U) / 64U + 1U) + (eBits - 1U) / 64U + 1U) * sizeof (uint64_t));
  bool b = load_pkey(modBits, eBits, nb, eb, pkey);
  if (b)
  {
    return Hacl_RSAPSS_rsapss_verify(a, modBits, eBits, pkey, saltLen, sgntLen, sgnt, msgLen, msg);
  }
  return false;
}